

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fUniformApiTests.cpp
# Opt level: O2

VarType * deqp::gles2::Functional::generateRandomType
                    (VarType *__return_storage_ptr__,int maxDepth,int *curStructIdx,
                    vector<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>
                    *structTypesDst,Random *rnd)

{
  DataType basicType;
  _Alloc_hider name;
  VarType *pVVar1;
  deUint32 dVar2;
  StructType *this;
  Precision precision;
  bool bVar3;
  float fVar4;
  int local_b4;
  StructType *structType;
  uint local_a4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  VarType *local_80;
  vector<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_> *local_78;
  Type *local_70;
  string local_68;
  VarType local_48;
  
  local_78 = structTypesDst;
  local_70 = (Type *)curStructIdx;
  if (maxDepth < 1) {
    bVar3 = false;
  }
  else {
    fVar4 = deRandom_getFloat(&rnd->m_rnd);
    bVar3 = fVar4 < 0.2;
  }
  fVar4 = deRandom_getFloat(&rnd->m_rnd);
  dVar2 = deRandom_getUint32(&rnd->m_rnd);
  if (bVar3) {
    local_a4 = dVar2 % 5;
    this = (StructType *)operator_new(0x38);
    local_48.m_type = *local_70;
    *local_70 = local_48.m_type + TYPE_ARRAY;
    de::toString<int>(&local_68,(int *)&local_48);
    std::operator+(&local_a0,"structType",&local_68);
    local_80 = __return_storage_ptr__;
    glu::StructType::StructType(this,local_a0._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_68);
    structType = this;
    for (local_b4 = 0; local_b4 <= (int)local_a4; local_b4 = local_b4 + 1) {
      de::toString<int>(&local_68,&local_b4);
      std::operator+(&local_a0,"m",&local_68);
      name._M_p = local_a0._M_dataplus._M_p;
      generateRandomType(&local_48,maxDepth + -1,(int *)local_70,local_78,rnd);
      glu::StructType::addMember(this,name._M_p,&local_48);
      glu::VarType::~VarType(&local_48);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_68);
    }
    std::vector<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>::push_back
              (local_78,&structType);
    pVVar1 = local_80;
    if (0.3 <= fVar4) {
      glu::VarType::VarType(local_80,structType);
      return pVVar1;
    }
    glu::VarType::VarType((VarType *)&local_a0,structType);
    dVar2 = deRandom_getUint32(&rnd->m_rnd);
    __return_storage_ptr__ = local_80;
    glu::VarType::VarType(local_80,(VarType *)&local_a0,dVar2 % 5 + 1);
  }
  else {
    basicType = (&s_testDataTypes)[(ulong)dVar2 % 0x11];
    bVar3 = basicType - TYPE_BOOL < 4;
    precision = bVar3 + 1 + (uint)bVar3;
    if (0.3 <= fVar4) {
      glu::VarType::VarType(__return_storage_ptr__,basicType,precision);
      return __return_storage_ptr__;
    }
    glu::VarType::VarType((VarType *)&local_a0,basicType,precision);
    dVar2 = deRandom_getUint32(&rnd->m_rnd);
    glu::VarType::VarType(__return_storage_ptr__,(VarType *)&local_a0,dVar2 % 5 + 1);
  }
  glu::VarType::~VarType((VarType *)&local_a0);
  return __return_storage_ptr__;
}

Assistant:

static glu::VarType generateRandomType (const int maxDepth, int& curStructIdx, vector<const StructType*>& structTypesDst, Random& rnd)
{
	const bool isStruct		= maxDepth > 0 && rnd.getFloat() < 0.2f;
	const bool isArray		= rnd.getFloat() < 0.3f;

	if (isStruct)
	{
		const int			numMembers = rnd.getInt(1, 5);
		StructType* const	structType = new StructType(("structType" + de::toString(curStructIdx++)).c_str());

		for (int i = 0; i < numMembers; i++)
			structType->addMember(("m" + de::toString(i)).c_str(), generateRandomType(maxDepth-1, curStructIdx, structTypesDst, rnd));

		structTypesDst.push_back(structType);
		return isArray ? glu::VarType(glu::VarType(structType), rnd.getInt(1, 5)) : glu::VarType(structType);
	}
	else
	{
		const glu::DataType		basicType = (glu::DataType)s_testDataTypes[rnd.getInt(0, DE_LENGTH_OF_ARRAY(s_testDataTypes)-1)];
		const glu::Precision	precision = glu::isDataTypeBoolOrBVec(basicType) ? glu::PRECISION_LAST : glu::PRECISION_MEDIUMP;
		return isArray ? glu::VarType(glu::VarType(basicType, precision), rnd.getInt(1, 5)) : glu::VarType(basicType, precision);
	}
}